

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringmatcher.h
# Opt level: O0

R_conflict10 __thiscall
QtPrivate::
q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
::operator()(q_boyer_moore_searcher_hashed_needle<const_char_*,_QtPrivate::QCaseInsensitiveLatin1Hash,_std::equal_to<void>_>
             *this,char *first,char *last,char *pat_first,char *pat_last)

{
  R_conflict10 RVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  long in_RCX;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  char *match;
  qsizetype skip;
  char *current;
  qsizetype pl_minus_one;
  difference_type pat_length;
  equal_to<void> pred;
  QCaseInsensitiveLatin1Hash hf;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  char *local_70;
  char *local_30;
  char *local_28;
  uchar local_19;
  size_t local_18;
  equal_to<void> local_a;
  QCaseInsensitiveLatin1Hash local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = (QCaseInsensitiveLatin1Hash)0xaa;
  local_a = (equal_to<void>)0xaa;
  uVar3 = std::distance<char_const*>(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  local_30 = in_RSI;
  local_28 = in_RSI;
  if (uVar3 != 0) {
    lVar4 = uVar3 - 1;
    for (local_70 = in_RSI + lVar4; local_30 = in_RDX, local_28 = in_RDX, local_70 < in_RDX;
        local_70 = local_70 + uVar7) {
      sVar5 = QCaseInsensitiveLatin1Hash::operator()(&local_9,*local_70);
      uVar7 = (ulong)*(byte *)(in_RDI + sVar5);
      if (uVar7 == 0) {
        for (lVar6 = 0; lVar6 < (long)uVar3; lVar6 = lVar6 + 1) {
          local_18 = QCaseInsensitiveLatin1Hash::operator()(&local_9,local_70[-lVar6]);
          local_19 = *(uchar *)(in_RCX + (lVar4 - lVar6));
          bVar2 = std::equal_to<void>::operator()(&local_a,&local_18,&local_19);
          if (((bVar2 ^ 0xffU) & 1) != 0) break;
        }
        if (lVar4 < lVar6) {
          local_30 = local_70 + (1 - lVar6);
          local_28 = local_30 + uVar3;
          break;
        }
        sVar5 = QCaseInsensitiveLatin1Hash::operator()(&local_9,local_70[-lVar6]);
        if (*(byte *)(in_RDI + sVar5) == uVar3) {
          uVar7 = uVar3 - lVar6;
        }
        else {
          uVar7 = 1;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  RVar1.end = local_28;
  RVar1.begin = local_30;
  return RVar1;
}

Assistant:

constexpr auto operator()(RandomIt2 first, RandomIt2 last, RandomIt1 pat_first,
                              RandomIt1 pat_last) const
    {
        struct R
        {
            RandomIt2 begin, end;
        };
        Hash hf;
        BinaryPredicate pred;
        auto pat_length = std::distance(pat_first, pat_last);
        if (pat_length == 0)
            return R{ first, first };

        const qsizetype pl_minus_one = qsizetype(pat_length - 1);
        RandomIt2 current = first + pl_minus_one;

        while (current < last) {
            qsizetype skip = m_skiptable[hf(*current)];
            if (!skip) {
                // possible match
                while (skip < pat_length) {
                    if (!pred(hf(*(current - skip)), uchar(pat_first[pl_minus_one - skip])))
                        break;
                    skip++;
                }
                if (skip > pl_minus_one) { // we have a match
                    auto match = current - skip + 1;
                    return R{ match, match + pat_length };
                }

                // If we don't have a match we are a bit inefficient as we only skip by one
                // when we have the non matching char in the string.
                if (m_skiptable[hf(*(current - skip))] == pat_length)
                    skip = pat_length - skip;
                else
                    skip = 1;
            }
            current += skip;
        }

        return R{ last, last };
    }